

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O2

void idct32_stage6_sse4_1
               (__m128i *bf1,__m128i *cospim32,__m128i *cospi32,__m128i *cospim16,__m128i *cospi48,
               __m128i *cospi16,__m128i *cospim48,__m128i *clamp_lo,__m128i *clamp_hi,
               __m128i *rounding,int bit)

{
  __m128i alVar1;
  __m128i alVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  uint uVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  uint uVar22;
  int iVar24;
  uint uVar25;
  int iVar26;
  uint uVar27;
  undefined1 auVar23 [16];
  int iVar28;
  uint uVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  
  alVar1 = bf1[5];
  alVar2 = bf1[6];
  iVar9 = (int)bf1[8][0];
  iVar11 = *(int *)((long)bf1[8] + 4);
  iVar13 = (int)bf1[8][1];
  iVar15 = *(int *)((long)bf1[8] + 0xc);
  iVar5 = (int)bf1[9][0];
  iVar6 = *(int *)((long)bf1[9] + 4);
  iVar7 = (int)bf1[9][1];
  iVar8 = *(int *)((long)bf1[9] + 0xc);
  auVar3 = pmulld((undefined1  [16])*cospim32,(undefined1  [16])alVar1);
  auVar31 = pmulld((undefined1  [16])alVar2,(undefined1  [16])*cospi32);
  iVar17 = (int)(*rounding)[0];
  iVar18 = *(int *)((long)*rounding + 4);
  iVar19 = (int)(*rounding)[1];
  iVar20 = *(int *)((long)*rounding + 0xc);
  auVar4 = ZEXT416((uint)bit);
  auVar23._0_4_ = (int)alVar2[0] + (int)alVar1[0];
  auVar23._4_4_ = alVar2[0]._4_4_ + alVar1[0]._4_4_;
  auVar23._8_4_ = (int)alVar2[1] + (int)alVar1[1];
  auVar23._12_4_ = alVar2[1]._4_4_ + alVar1[1]._4_4_;
  auVar23 = pmulld(auVar23,(undefined1  [16])*cospi32);
  *(int *)bf1[6] = auVar23._0_4_ + iVar17 >> auVar4;
  *(int *)((long)bf1[6] + 4) = auVar23._4_4_ + iVar18 >> auVar4;
  *(int *)(bf1[6] + 1) = auVar23._8_4_ + iVar19 >> auVar4;
  *(int *)((long)bf1[6] + 0xc) = auVar23._12_4_ + iVar20 >> auVar4;
  *(int *)bf1[5] = auVar31._0_4_ + auVar3._0_4_ + iVar17 >> auVar4;
  *(int *)((long)bf1[5] + 4) = auVar31._4_4_ + auVar3._4_4_ + iVar18 >> auVar4;
  *(int *)(bf1[5] + 1) = auVar31._8_4_ + auVar3._8_4_ + iVar19 >> auVar4;
  *(int *)((long)bf1[5] + 0xc) = auVar31._12_4_ + auVar3._12_4_ + iVar20 >> auVar4;
  iVar17 = (int)bf1[0xb][0];
  iVar18 = *(int *)((long)bf1[0xb] + 4);
  iVar19 = (int)bf1[0xb][1];
  iVar20 = *(int *)((long)bf1[0xb] + 0xc);
  iVar21 = iVar17 + iVar9;
  iVar24 = iVar18 + iVar11;
  iVar26 = iVar19 + iVar13;
  iVar28 = iVar20 + iVar15;
  iVar9 = iVar9 - iVar17;
  iVar11 = iVar11 - iVar18;
  iVar13 = iVar13 - iVar19;
  iVar15 = iVar15 - iVar20;
  iVar17 = (int)(*clamp_lo)[0];
  iVar18 = *(int *)((long)*clamp_lo + 4);
  iVar19 = (int)(*clamp_lo)[1];
  iVar20 = *(int *)((long)*clamp_lo + 0xc);
  uVar22 = (uint)(iVar21 < iVar17) * iVar17 | (uint)(iVar21 >= iVar17) * iVar21;
  uVar25 = (uint)(iVar24 < iVar18) * iVar18 | (uint)(iVar24 >= iVar18) * iVar24;
  uVar27 = (uint)(iVar26 < iVar19) * iVar19 | (uint)(iVar26 >= iVar19) * iVar26;
  uVar29 = (uint)(iVar28 < iVar20) * iVar20 | (uint)(iVar28 >= iVar20) * iVar28;
  iVar21 = (int)(*clamp_hi)[0];
  iVar24 = *(int *)((long)*clamp_hi + 4);
  iVar26 = (int)(*clamp_hi)[1];
  iVar28 = *(int *)((long)*clamp_hi + 0xc);
  uVar10 = (uint)(iVar9 < iVar17) * iVar17 | (uint)(iVar9 >= iVar17) * iVar9;
  uVar12 = (uint)(iVar11 < iVar18) * iVar18 | (uint)(iVar11 >= iVar18) * iVar11;
  uVar14 = (uint)(iVar13 < iVar19) * iVar19 | (uint)(iVar13 >= iVar19) * iVar13;
  uVar16 = (uint)(iVar15 < iVar20) * iVar20 | (uint)(iVar15 >= iVar20) * iVar15;
  *(uint *)bf1[8] = (uint)(iVar21 < (int)uVar22) * iVar21 | (iVar21 >= (int)uVar22) * uVar22;
  *(uint *)((long)bf1[8] + 4) =
       (uint)(iVar24 < (int)uVar25) * iVar24 | (iVar24 >= (int)uVar25) * uVar25;
  *(uint *)(bf1[8] + 1) = (uint)(iVar26 < (int)uVar27) * iVar26 | (iVar26 >= (int)uVar27) * uVar27;
  *(uint *)((long)bf1[8] + 0xc) =
       (uint)(iVar28 < (int)uVar29) * iVar28 | (iVar28 >= (int)uVar29) * uVar29;
  *(uint *)bf1[0xb] = (uint)(iVar21 < (int)uVar10) * iVar21 | (iVar21 >= (int)uVar10) * uVar10;
  *(uint *)((long)bf1[0xb] + 4) =
       (uint)(iVar24 < (int)uVar12) * iVar24 | (iVar24 >= (int)uVar12) * uVar12;
  *(uint *)(bf1[0xb] + 1) = (uint)(iVar26 < (int)uVar14) * iVar26 | (iVar26 >= (int)uVar14) * uVar14
  ;
  *(uint *)((long)bf1[0xb] + 0xc) =
       (uint)(iVar28 < (int)uVar16) * iVar28 | (iVar28 >= (int)uVar16) * uVar16;
  iVar9 = (int)bf1[10][0];
  iVar11 = *(int *)((long)bf1[10] + 4);
  iVar13 = (int)bf1[10][1];
  iVar15 = *(int *)((long)bf1[10] + 0xc);
  iVar17 = iVar9 + iVar5;
  iVar18 = iVar11 + iVar6;
  iVar19 = iVar13 + iVar7;
  iVar20 = iVar15 + iVar8;
  iVar5 = iVar5 - iVar9;
  iVar6 = iVar6 - iVar11;
  iVar7 = iVar7 - iVar13;
  iVar8 = iVar8 - iVar15;
  iVar9 = (int)(*clamp_lo)[0];
  iVar11 = *(int *)((long)*clamp_lo + 4);
  iVar13 = (int)(*clamp_lo)[1];
  iVar15 = *(int *)((long)*clamp_lo + 0xc);
  uVar22 = (uint)(iVar17 < iVar9) * iVar9 | (uint)(iVar17 >= iVar9) * iVar17;
  uVar25 = (uint)(iVar18 < iVar11) * iVar11 | (uint)(iVar18 >= iVar11) * iVar18;
  uVar27 = (uint)(iVar19 < iVar13) * iVar13 | (uint)(iVar19 >= iVar13) * iVar19;
  uVar29 = (uint)(iVar20 < iVar15) * iVar15 | (uint)(iVar20 >= iVar15) * iVar20;
  iVar17 = (int)(*clamp_hi)[0];
  iVar18 = *(int *)((long)*clamp_hi + 4);
  iVar19 = (int)(*clamp_hi)[1];
  iVar20 = *(int *)((long)*clamp_hi + 0xc);
  uVar10 = (uint)(iVar5 < iVar9) * iVar9 | (uint)(iVar5 >= iVar9) * iVar5;
  uVar12 = (uint)(iVar6 < iVar11) * iVar11 | (uint)(iVar6 >= iVar11) * iVar6;
  uVar14 = (uint)(iVar7 < iVar13) * iVar13 | (uint)(iVar7 >= iVar13) * iVar7;
  uVar16 = (uint)(iVar8 < iVar15) * iVar15 | (uint)(iVar8 >= iVar15) * iVar8;
  *(uint *)bf1[9] = (uint)(iVar17 < (int)uVar22) * iVar17 | (iVar17 >= (int)uVar22) * uVar22;
  *(uint *)((long)bf1[9] + 4) =
       (uint)(iVar18 < (int)uVar25) * iVar18 | (iVar18 >= (int)uVar25) * uVar25;
  *(uint *)(bf1[9] + 1) = (uint)(iVar19 < (int)uVar27) * iVar19 | (iVar19 >= (int)uVar27) * uVar27;
  *(uint *)((long)bf1[9] + 0xc) =
       (uint)(iVar20 < (int)uVar29) * iVar20 | (iVar20 >= (int)uVar29) * uVar29;
  *(uint *)bf1[10] = (uint)(iVar17 < (int)uVar10) * iVar17 | (iVar17 >= (int)uVar10) * uVar10;
  *(uint *)((long)bf1[10] + 4) =
       (uint)(iVar18 < (int)uVar12) * iVar18 | (iVar18 >= (int)uVar12) * uVar12;
  *(uint *)(bf1[10] + 1) = (uint)(iVar19 < (int)uVar14) * iVar19 | (iVar19 >= (int)uVar14) * uVar14;
  *(uint *)((long)bf1[10] + 0xc) =
       (uint)(iVar20 < (int)uVar16) * iVar20 | (iVar20 >= (int)uVar16) * uVar16;
  iVar9 = (int)bf1[0xc][0];
  iVar11 = *(int *)((long)bf1[0xc] + 4);
  iVar13 = (int)bf1[0xc][1];
  iVar15 = *(int *)((long)bf1[0xc] + 0xc);
  iVar5 = (int)bf1[0xf][0];
  iVar6 = *(int *)((long)bf1[0xf] + 4);
  iVar7 = (int)bf1[0xf][1];
  iVar8 = *(int *)((long)bf1[0xf] + 0xc);
  iVar17 = iVar9 + iVar5;
  iVar18 = iVar11 + iVar6;
  iVar19 = iVar13 + iVar7;
  iVar20 = iVar15 + iVar8;
  iVar5 = iVar5 - iVar9;
  iVar6 = iVar6 - iVar11;
  iVar7 = iVar7 - iVar13;
  iVar8 = iVar8 - iVar15;
  iVar9 = (int)(*clamp_lo)[0];
  iVar11 = *(int *)((long)*clamp_lo + 4);
  iVar13 = (int)(*clamp_lo)[1];
  iVar15 = *(int *)((long)*clamp_lo + 0xc);
  uVar22 = (uint)(iVar17 < iVar9) * iVar9 | (uint)(iVar17 >= iVar9) * iVar17;
  uVar25 = (uint)(iVar18 < iVar11) * iVar11 | (uint)(iVar18 >= iVar11) * iVar18;
  uVar27 = (uint)(iVar19 < iVar13) * iVar13 | (uint)(iVar19 >= iVar13) * iVar19;
  uVar29 = (uint)(iVar20 < iVar15) * iVar15 | (uint)(iVar20 >= iVar15) * iVar20;
  iVar17 = (int)(*clamp_hi)[0];
  iVar18 = *(int *)((long)*clamp_hi + 4);
  iVar19 = (int)(*clamp_hi)[1];
  iVar20 = *(int *)((long)*clamp_hi + 0xc);
  uVar10 = (uint)(iVar5 < iVar9) * iVar9 | (uint)(iVar5 >= iVar9) * iVar5;
  uVar12 = (uint)(iVar6 < iVar11) * iVar11 | (uint)(iVar6 >= iVar11) * iVar6;
  uVar14 = (uint)(iVar7 < iVar13) * iVar13 | (uint)(iVar7 >= iVar13) * iVar7;
  uVar16 = (uint)(iVar8 < iVar15) * iVar15 | (uint)(iVar8 >= iVar15) * iVar8;
  *(uint *)bf1[0xf] = (uint)(iVar17 < (int)uVar22) * iVar17 | (iVar17 >= (int)uVar22) * uVar22;
  *(uint *)((long)bf1[0xf] + 4) =
       (uint)(iVar18 < (int)uVar25) * iVar18 | (iVar18 >= (int)uVar25) * uVar25;
  *(uint *)(bf1[0xf] + 1) = (uint)(iVar19 < (int)uVar27) * iVar19 | (iVar19 >= (int)uVar27) * uVar27
  ;
  *(uint *)((long)bf1[0xf] + 0xc) =
       (uint)(iVar20 < (int)uVar29) * iVar20 | (iVar20 >= (int)uVar29) * uVar29;
  *(uint *)bf1[0xc] = (uint)(iVar17 < (int)uVar10) * iVar17 | (iVar17 >= (int)uVar10) * uVar10;
  *(uint *)((long)bf1[0xc] + 4) =
       (uint)(iVar18 < (int)uVar12) * iVar18 | (iVar18 >= (int)uVar12) * uVar12;
  *(uint *)(bf1[0xc] + 1) = (uint)(iVar19 < (int)uVar14) * iVar19 | (iVar19 >= (int)uVar14) * uVar14
  ;
  *(uint *)((long)bf1[0xc] + 0xc) =
       (uint)(iVar20 < (int)uVar16) * iVar20 | (iVar20 >= (int)uVar16) * uVar16;
  iVar9 = (int)bf1[0xd][0];
  iVar11 = *(int *)((long)bf1[0xd] + 4);
  iVar13 = (int)bf1[0xd][1];
  iVar15 = *(int *)((long)bf1[0xd] + 0xc);
  iVar5 = (int)bf1[0xe][0];
  iVar6 = *(int *)((long)bf1[0xe] + 4);
  iVar7 = (int)bf1[0xe][1];
  iVar8 = *(int *)((long)bf1[0xe] + 0xc);
  iVar17 = iVar9 + iVar5;
  iVar18 = iVar11 + iVar6;
  iVar19 = iVar13 + iVar7;
  iVar20 = iVar15 + iVar8;
  iVar5 = iVar5 - iVar9;
  iVar6 = iVar6 - iVar11;
  iVar7 = iVar7 - iVar13;
  iVar8 = iVar8 - iVar15;
  iVar9 = (int)(*clamp_lo)[0];
  iVar11 = *(int *)((long)*clamp_lo + 4);
  iVar13 = (int)(*clamp_lo)[1];
  iVar15 = *(int *)((long)*clamp_lo + 0xc);
  uVar22 = (uint)(iVar17 < iVar9) * iVar9 | (uint)(iVar17 >= iVar9) * iVar17;
  uVar25 = (uint)(iVar18 < iVar11) * iVar11 | (uint)(iVar18 >= iVar11) * iVar18;
  uVar27 = (uint)(iVar19 < iVar13) * iVar13 | (uint)(iVar19 >= iVar13) * iVar19;
  uVar29 = (uint)(iVar20 < iVar15) * iVar15 | (uint)(iVar20 >= iVar15) * iVar20;
  iVar17 = (int)(*clamp_hi)[0];
  iVar18 = *(int *)((long)*clamp_hi + 4);
  iVar19 = (int)(*clamp_hi)[1];
  iVar20 = *(int *)((long)*clamp_hi + 0xc);
  uVar10 = (uint)(iVar5 < iVar9) * iVar9 | (uint)(iVar5 >= iVar9) * iVar5;
  uVar12 = (uint)(iVar6 < iVar11) * iVar11 | (uint)(iVar6 >= iVar11) * iVar6;
  uVar14 = (uint)(iVar7 < iVar13) * iVar13 | (uint)(iVar7 >= iVar13) * iVar7;
  uVar16 = (uint)(iVar8 < iVar15) * iVar15 | (uint)(iVar8 >= iVar15) * iVar8;
  *(uint *)bf1[0xe] = (uint)(iVar17 < (int)uVar22) * iVar17 | (iVar17 >= (int)uVar22) * uVar22;
  *(uint *)((long)bf1[0xe] + 4) =
       (uint)(iVar18 < (int)uVar25) * iVar18 | (iVar18 >= (int)uVar25) * uVar25;
  *(uint *)(bf1[0xe] + 1) = (uint)(iVar19 < (int)uVar27) * iVar19 | (iVar19 >= (int)uVar27) * uVar27
  ;
  *(uint *)((long)bf1[0xe] + 0xc) =
       (uint)(iVar20 < (int)uVar29) * iVar20 | (iVar20 >= (int)uVar29) * uVar29;
  *(uint *)bf1[0xd] = (uint)(iVar17 < (int)uVar10) * iVar17 | (iVar17 >= (int)uVar10) * uVar10;
  *(uint *)((long)bf1[0xd] + 4) =
       (uint)(iVar18 < (int)uVar12) * iVar18 | (iVar18 >= (int)uVar12) * uVar12;
  *(uint *)(bf1[0xd] + 1) = (uint)(iVar19 < (int)uVar14) * iVar19 | (iVar19 >= (int)uVar14) * uVar14
  ;
  *(uint *)((long)bf1[0xd] + 0xc) =
       (uint)(iVar20 < (int)uVar16) * iVar20 | (iVar20 >= (int)uVar16) * uVar16;
  auVar23 = pmulld((undefined1  [16])*cospim16,(undefined1  [16])bf1[0x12]);
  auVar30 = pmulld((undefined1  [16])bf1[0x1d],(undefined1  [16])*cospi48);
  iVar9 = (int)(*rounding)[0];
  iVar11 = *(int *)((long)*rounding + 4);
  iVar13 = (int)(*rounding)[1];
  iVar15 = *(int *)((long)*rounding + 0xc);
  auVar31 = pmulld((undefined1  [16])*cospi48,(undefined1  [16])bf1[0x12]);
  auVar3 = pmulld((undefined1  [16])bf1[0x1d],(undefined1  [16])*cospi16);
  *(int *)bf1[0x1d] = auVar31._0_4_ + iVar9 + auVar3._0_4_ >> auVar4;
  *(int *)((long)bf1[0x1d] + 4) = auVar31._4_4_ + iVar11 + auVar3._4_4_ >> auVar4;
  *(int *)(bf1[0x1d] + 1) = auVar31._8_4_ + iVar13 + auVar3._8_4_ >> auVar4;
  *(int *)((long)bf1[0x1d] + 0xc) = auVar31._12_4_ + iVar15 + auVar3._12_4_ >> auVar4;
  *(int *)bf1[0x12] = auVar30._0_4_ + auVar23._0_4_ + iVar9 >> auVar4;
  *(int *)((long)bf1[0x12] + 4) = auVar30._4_4_ + auVar23._4_4_ + iVar11 >> auVar4;
  *(int *)(bf1[0x12] + 1) = auVar30._8_4_ + auVar23._8_4_ + iVar13 >> auVar4;
  *(int *)((long)bf1[0x12] + 0xc) = auVar30._12_4_ + auVar23._12_4_ + iVar15 >> auVar4;
  auVar23 = pmulld((undefined1  [16])*cospim16,(undefined1  [16])bf1[0x13]);
  auVar30 = pmulld((undefined1  [16])bf1[0x1c],(undefined1  [16])*cospi48);
  iVar9 = (int)(*rounding)[0];
  iVar11 = *(int *)((long)*rounding + 4);
  iVar13 = (int)(*rounding)[1];
  iVar15 = *(int *)((long)*rounding + 0xc);
  auVar31 = pmulld((undefined1  [16])*cospi48,(undefined1  [16])bf1[0x13]);
  auVar3 = pmulld((undefined1  [16])bf1[0x1c],(undefined1  [16])*cospi16);
  *(int *)bf1[0x1c] = auVar31._0_4_ + iVar9 + auVar3._0_4_ >> auVar4;
  *(int *)((long)bf1[0x1c] + 4) = auVar31._4_4_ + iVar11 + auVar3._4_4_ >> auVar4;
  *(int *)(bf1[0x1c] + 1) = auVar31._8_4_ + iVar13 + auVar3._8_4_ >> auVar4;
  *(int *)((long)bf1[0x1c] + 0xc) = auVar31._12_4_ + iVar15 + auVar3._12_4_ >> auVar4;
  *(int *)bf1[0x13] = auVar30._0_4_ + auVar23._0_4_ + iVar9 >> auVar4;
  *(int *)((long)bf1[0x13] + 4) = auVar30._4_4_ + auVar23._4_4_ + iVar11 >> auVar4;
  *(int *)(bf1[0x13] + 1) = auVar30._8_4_ + auVar23._8_4_ + iVar13 >> auVar4;
  *(int *)((long)bf1[0x13] + 0xc) = auVar30._12_4_ + auVar23._12_4_ + iVar15 >> auVar4;
  auVar23 = pmulld((undefined1  [16])*cospim48,(undefined1  [16])bf1[0x14]);
  auVar30 = pmulld((undefined1  [16])bf1[0x1b],(undefined1  [16])*cospim16);
  iVar9 = (int)(*rounding)[0];
  iVar11 = *(int *)((long)*rounding + 4);
  iVar13 = (int)(*rounding)[1];
  iVar15 = *(int *)((long)*rounding + 0xc);
  auVar31 = pmulld((undefined1  [16])*cospim16,(undefined1  [16])bf1[0x14]);
  auVar3 = pmulld((undefined1  [16])bf1[0x1b],(undefined1  [16])*cospi48);
  *(int *)bf1[0x1b] = auVar31._0_4_ + iVar9 + auVar3._0_4_ >> auVar4;
  *(int *)((long)bf1[0x1b] + 4) = auVar31._4_4_ + iVar11 + auVar3._4_4_ >> auVar4;
  *(int *)(bf1[0x1b] + 1) = auVar31._8_4_ + iVar13 + auVar3._8_4_ >> auVar4;
  *(int *)((long)bf1[0x1b] + 0xc) = auVar31._12_4_ + iVar15 + auVar3._12_4_ >> auVar4;
  *(int *)bf1[0x14] = auVar30._0_4_ + iVar9 + auVar23._0_4_ >> auVar4;
  *(int *)((long)bf1[0x14] + 4) = auVar30._4_4_ + iVar11 + auVar23._4_4_ >> auVar4;
  *(int *)(bf1[0x14] + 1) = auVar30._8_4_ + iVar13 + auVar23._8_4_ >> auVar4;
  *(int *)((long)bf1[0x14] + 0xc) = auVar30._12_4_ + iVar15 + auVar23._12_4_ >> auVar4;
  auVar23 = pmulld((undefined1  [16])*cospim48,(undefined1  [16])bf1[0x15]);
  auVar30 = pmulld((undefined1  [16])bf1[0x1a],(undefined1  [16])*cospim16);
  iVar9 = (int)(*rounding)[0];
  iVar11 = *(int *)((long)*rounding + 4);
  iVar13 = (int)(*rounding)[1];
  iVar15 = *(int *)((long)*rounding + 0xc);
  auVar31 = pmulld((undefined1  [16])*cospim16,(undefined1  [16])bf1[0x15]);
  auVar3 = pmulld((undefined1  [16])bf1[0x1a],(undefined1  [16])*cospi48);
  *(int *)bf1[0x1a] = auVar31._0_4_ + iVar9 + auVar3._0_4_ >> auVar4;
  *(int *)((long)bf1[0x1a] + 4) = auVar31._4_4_ + iVar11 + auVar3._4_4_ >> auVar4;
  *(int *)(bf1[0x1a] + 1) = auVar31._8_4_ + iVar13 + auVar3._8_4_ >> auVar4;
  *(int *)((long)bf1[0x1a] + 0xc) = auVar31._12_4_ + iVar15 + auVar3._12_4_ >> auVar4;
  *(int *)bf1[0x15] = auVar30._0_4_ + iVar9 + auVar23._0_4_ >> auVar4;
  *(int *)((long)bf1[0x15] + 4) = auVar30._4_4_ + iVar11 + auVar23._4_4_ >> auVar4;
  *(int *)(bf1[0x15] + 1) = auVar30._8_4_ + iVar13 + auVar23._8_4_ >> auVar4;
  *(int *)((long)bf1[0x15] + 0xc) = auVar30._12_4_ + iVar15 + auVar23._12_4_ >> auVar4;
  return;
}

Assistant:

static inline void idct32_stage6_sse4_1(
    __m128i *bf1, const __m128i *cospim32, const __m128i *cospi32,
    const __m128i *cospim16, const __m128i *cospi48, const __m128i *cospi16,
    const __m128i *cospim48, const __m128i *clamp_lo, const __m128i *clamp_hi,
    const __m128i *rounding, int bit) {
  __m128i temp1, temp2;
  temp1 = half_btf_sse4_1(cospim32, &bf1[5], cospi32, &bf1[6], rounding, bit);
  bf1[6] = half_btf_sse4_1(cospi32, &bf1[5], cospi32, &bf1[6], rounding, bit);
  bf1[5] = temp1;

  addsub_sse4_1(bf1[8], bf1[11], bf1 + 8, bf1 + 11, clamp_lo, clamp_hi);
  addsub_sse4_1(bf1[9], bf1[10], bf1 + 9, bf1 + 10, clamp_lo, clamp_hi);
  addsub_sse4_1(bf1[15], bf1[12], bf1 + 15, bf1 + 12, clamp_lo, clamp_hi);
  addsub_sse4_1(bf1[14], bf1[13], bf1 + 14, bf1 + 13, clamp_lo, clamp_hi);

  temp1 = half_btf_sse4_1(cospim16, &bf1[18], cospi48, &bf1[29], rounding, bit);
  bf1[29] =
      half_btf_sse4_1(cospi48, &bf1[18], cospi16, &bf1[29], rounding, bit);
  bf1[18] = temp1;
  temp2 = half_btf_sse4_1(cospim16, &bf1[19], cospi48, &bf1[28], rounding, bit);
  bf1[28] =
      half_btf_sse4_1(cospi48, &bf1[19], cospi16, &bf1[28], rounding, bit);
  bf1[19] = temp2;
  temp1 =
      half_btf_sse4_1(cospim48, &bf1[20], cospim16, &bf1[27], rounding, bit);
  bf1[27] =
      half_btf_sse4_1(cospim16, &bf1[20], cospi48, &bf1[27], rounding, bit);
  bf1[20] = temp1;
  temp2 =
      half_btf_sse4_1(cospim48, &bf1[21], cospim16, &bf1[26], rounding, bit);
  bf1[26] =
      half_btf_sse4_1(cospim16, &bf1[21], cospi48, &bf1[26], rounding, bit);
  bf1[21] = temp2;
}